

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListCommand.cxx
# Opt level: O2

bool __thiscall cmStringSorter::operator()(cmStringSorter *this,string *a,string *b)

{
  bool bVar1;
  string *__rhs;
  string *__lhs;
  string af;
  string bf;
  string local_50;
  string local_30;
  
  ApplyFilter(&local_50,this,a);
  ApplyFilter(&local_30,this,b);
  if (this->descending == true) {
    __lhs = &local_30;
    __rhs = &local_50;
  }
  else {
    __lhs = &local_50;
    __rhs = &local_30;
  }
  bVar1 = std::operator<(__lhs,__rhs);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  return bVar1;
}

Assistant:

bool operator()(const std::string& a, const std::string& b)
  {
    std::string af = ApplyFilter(a);
    std::string bf = ApplyFilter(b);
    bool result;
    if (descending) {
      result = bf < af;
    } else {
      result = af < bf;
    }
    return result;
  }